

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

void XYcZ_addC(tc_uECC_word_t *X1,tc_uECC_word_t *Y1,tc_uECC_word_t *X2,tc_uECC_word_t *Y2,
              tc_uECC_Curve curve)

{
  tc_uECC_word_t *mod;
  tc_uECC_word_t *right;
  wordcount_t num_words;
  tc_uECC_word_t local_b8 [2];
  tc_uECC_word_t t7 [8];
  tc_uECC_word_t t6 [8];
  tc_uECC_word_t t5 [8];
  
  num_words = curve->num_words;
  mod = curve->p;
  tc_uECC_vli_modSub(t6 + 6,X2,X1,mod,num_words);
  tc_uECC_vli_modSquare_fast(t6 + 6,t6 + 6,curve);
  tc_uECC_vli_modMult_fast(X1,X1,t6 + 6,curve);
  tc_uECC_vli_modMult_fast(X2,X2,t6 + 6,curve);
  tc_uECC_vli_modAdd(t6 + 6,Y2,Y1,mod,num_words);
  tc_uECC_vli_modSub(Y2,Y2,Y1,mod,num_words);
  tc_uECC_vli_modSub(t7 + 6,X2,X1,mod,num_words);
  tc_uECC_vli_modMult_fast(Y1,Y1,t7 + 6,curve);
  tc_uECC_vli_modAdd(t7 + 6,X1,X2,mod,num_words);
  tc_uECC_vli_modSquare_fast(X2,Y2,curve);
  tc_uECC_vli_modSub(X2,X2,t7 + 6,mod,num_words);
  tc_uECC_vli_modSub(local_b8,X1,X2,mod,num_words);
  tc_uECC_vli_modMult_fast(Y2,Y2,local_b8,curve);
  tc_uECC_vli_modSub(Y2,Y2,Y1,mod,num_words);
  tc_uECC_vli_modSquare_fast(local_b8,t6 + 6,curve);
  right = t7 + 6;
  tc_uECC_vli_modSub(local_b8,local_b8,right,mod,num_words);
  tc_uECC_vli_modSub(right,local_b8,X1,mod,num_words);
  tc_uECC_vli_modMult_fast(right,right,t6 + 6,curve);
  tc_uECC_vli_modSub(Y1,right,Y1,mod,num_words);
  tc_uECC_vli_set(X1,local_b8,num_words);
  return;
}

Assistant:

static void XYcZ_addC(tc_uECC_word_t * X1, tc_uECC_word_t * Y1,
		      tc_uECC_word_t * X2, tc_uECC_word_t * Y2,
		      tc_uECC_Curve curve)
{
	/* t1 = X1, t2 = Y1, t3 = X2, t4 = Y2 */
	tc_uECC_word_t t5[NUM_ECC_WORDS];
	tc_uECC_word_t t6[NUM_ECC_WORDS];
	tc_uECC_word_t t7[NUM_ECC_WORDS];
	wordcount_t num_words = curve->num_words;

	tc_uECC_vli_modSub(t5, X2, X1, curve->p, num_words); /* t5 = x2 - x1 */
	tc_uECC_vli_modSquare_fast(t5, t5, curve); /* t5 = (x2 - x1)^2 = A */
	tc_uECC_vli_modMult_fast(X1, X1, t5, curve); /* t1 = x1*A = B */
	tc_uECC_vli_modMult_fast(X2, X2, t5, curve); /* t3 = x2*A = C */
	tc_uECC_vli_modAdd(t5, Y2, Y1, curve->p, num_words); /* t5 = y2 + y1 */
	tc_uECC_vli_modSub(Y2, Y2, Y1, curve->p, num_words); /* t4 = y2 - y1 */

	tc_uECC_vli_modSub(t6, X2, X1, curve->p, num_words); /* t6 = C - B */
	tc_uECC_vli_modMult_fast(Y1, Y1, t6, curve); /* t2 = y1 * (C - B) = E */
	tc_uECC_vli_modAdd(t6, X1, X2, curve->p, num_words); /* t6 = B + C */
	tc_uECC_vli_modSquare_fast(X2, Y2, curve); /* t3 = (y2 - y1)^2 = D */
	tc_uECC_vli_modSub(X2, X2, t6, curve->p, num_words); /* t3 = D - (B + C) = x3 */

	tc_uECC_vli_modSub(t7, X1, X2, curve->p, num_words); /* t7 = B - x3 */
	tc_uECC_vli_modMult_fast(Y2, Y2, t7, curve); /* t4 = (y2 - y1)*(B - x3) */
	/* t4 = (y2 - y1)*(B - x3) - E = y3: */
	tc_uECC_vli_modSub(Y2, Y2, Y1, curve->p, num_words);

	tc_uECC_vli_modSquare_fast(t7, t5, curve); /* t7 = (y2 + y1)^2 = F */
	tc_uECC_vli_modSub(t7, t7, t6, curve->p, num_words); /* t7 = F - (B + C) = x3' */
	tc_uECC_vli_modSub(t6, t7, X1, curve->p, num_words); /* t6 = x3' - B */
	tc_uECC_vli_modMult_fast(t6, t6, t5, curve); /* t6 = (y2+y1)*(x3' - B) */
	/* t2 = (y2+y1)*(x3' - B) - E = y3': */
	tc_uECC_vli_modSub(Y1, t6, Y1, curve->p, num_words);

	tc_uECC_vli_set(X1, t7, num_words);
}